

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

ArgumentsValue * __thiscall
minja::ArgumentsExpression::evaluate
          (ArgumentsValue *__return_storage_ptr__,ArgumentsExpression *this,
          shared_ptr<minja::Context> *context)

{
  pointer psVar1;
  pointer ppVar2;
  runtime_error *prVar3;
  pointer psVar4;
  pointer __x;
  shared_ptr<minja::UnaryOpExpr> un_expr;
  _Any_data local_f0;
  code *local_e0;
  code *local_d8;
  Value array;
  
  (__return_storage_ptr__->kwargs).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->kwargs).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->args).super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->kwargs).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->args).super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->args).super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar4 = (this->args).
           super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->args).
           super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar4 == psVar1) {
      ppVar2 = (this->kwargs).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__x = (this->kwargs).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __x != ppVar2; __x = __x + 1) {
        Expression::evaluate
                  ((Value *)&local_f0,
                   (__x->second).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,context);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>
        ::pair<minja::Value,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>
                    *)&array,&__x->first,(Value *)&local_f0);
        std::
        vector<std::pair<std::__cxx11::string,minja::Value>,std::allocator<std::pair<std::__cxx11::string,minja::Value>>>
        ::emplace_back<std::pair<std::__cxx11::string,minja::Value>>
                  ((vector<std::pair<std::__cxx11::string,minja::Value>,std::allocator<std::pair<std::__cxx11::string,minja::Value>>>
                    *)&__return_storage_ptr__->kwargs,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>
                    *)&array);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>
                 *)&array);
        Value::~Value((Value *)&local_f0);
      }
      return __return_storage_ptr__;
    }
    std::dynamic_pointer_cast<minja::UnaryOpExpr,minja::Expression>
              ((shared_ptr<minja::Expression> *)&un_expr);
    if (un_expr.super___shared_ptr<minja::UnaryOpExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
LAB_001ccf0e:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&un_expr.super___shared_ptr<minja::UnaryOpExpr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      Expression::evaluate
                (&array,(psVar4->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr,context);
      std::vector<minja::Value,_std::allocator<minja::Value>_>::emplace_back<minja::Value>
                (&__return_storage_ptr__->args,&array);
      Value::~Value(&array);
    }
    else {
      if ((un_expr.super___shared_ptr<minja::UnaryOpExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->op ==
          ExpansionDict) {
        Expression::evaluate
                  (&array,((un_expr.
                            super___shared_ptr<minja::UnaryOpExpr,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->expr).
                          super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   context);
        if (array.object_.
            super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr == (element_type *)0x0) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar3,"ExpansionDict operator only supported on objects");
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_d8 = std::
                   _Function_handler<void_(minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:1378:35)>
                   ::_M_invoke;
        local_e0 = std::
                   _Function_handler<void_(minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:1378:35)>
                   ::_M_manager;
        local_f0._M_unused._M_object = __return_storage_ptr__;
        local_f0._8_8_ = &array;
        Value::for_each(&array,(function<void_(minja::Value_&)> *)&local_f0);
      }
      else {
        if ((un_expr.super___shared_ptr<minja::UnaryOpExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->op
            != Expansion) goto LAB_001ccf0e;
        Expression::evaluate
                  (&array,((un_expr.
                            super___shared_ptr<minja::UnaryOpExpr,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->expr).
                          super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   context);
        if (array.array_.
            super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr == (element_type *)0x0) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,"Expansion operator only supported on arrays");
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_f0._8_8_ = (Value *)0x0;
        local_d8 = std::
                   _Function_handler<void_(minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:1369:36)>
                   ::_M_invoke;
        local_e0 = std::
                   _Function_handler<void_(minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:1369:36)>
                   ::_M_manager;
        local_f0._M_unused._M_object = __return_storage_ptr__;
        Value::for_each(&array,(function<void_(minja::Value_&)> *)&local_f0);
      }
      std::_Function_base::~_Function_base((_Function_base *)&local_f0);
      Value::~Value(&array);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&un_expr.super___shared_ptr<minja::UnaryOpExpr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    psVar4 = psVar4 + 1;
  } while( true );
}

Assistant:

ArgumentsValue evaluate(const std::shared_ptr<Context> & context) const {
        ArgumentsValue vargs;
        for (const auto& arg : this->args) {
            if (auto un_expr = std::dynamic_pointer_cast<UnaryOpExpr>(arg)) {
                if (un_expr->op == UnaryOpExpr::Op::Expansion) {
                    auto array = un_expr->expr->evaluate(context);
                    if (!array.is_array()) {
                        throw std::runtime_error("Expansion operator only supported on arrays");
                    }
                    array.for_each([&](Value & value) {
                        vargs.args.push_back(value);
                    });
                    continue;
                } else if (un_expr->op == UnaryOpExpr::Op::ExpansionDict) {
                    auto dict = un_expr->expr->evaluate(context);
                    if (!dict.is_object()) {
                        throw std::runtime_error("ExpansionDict operator only supported on objects");
                    }
                    dict.for_each([&](const Value & key) {
                        vargs.kwargs.push_back({key.get<std::string>(), dict.at(key)});
                    });
                    continue;
                }
            }
            vargs.args.push_back(arg->evaluate(context));
        }
        for (const auto& [name, value] : this->kwargs) {
            vargs.kwargs.push_back({name, value->evaluate(context)});
        }
        return vargs;
    }